

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O0

void __thiscall SuffixTest_Cast_Test::TestBody(SuffixTest_Cast_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  SuffixTable *table;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Suffix s;
  IntSuffix is;
  Suffix *in_stack_fffffffffffffed8;
  SuffixBase in_stack_fffffffffffffee0;
  SuffixBase in_stack_fffffffffffffee8;
  SuffixBase s_00;
  char *in_stack_fffffffffffffef0;
  AssertionResult *pAVar3;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int line;
  char *in_stack_ffffffffffffff00;
  Type type;
  undefined7 in_stack_ffffffffffffff10;
  string *this_01;
  BasicSuffixSet<std::allocator<char>_> *in_stack_ffffffffffffff28;
  StringRef in_stack_ffffffffffffff30;
  undefined1 local_b0 [8];
  Message *in_stack_ffffffffffffff58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  AssertionResult local_78;
  Impl *local_68;
  string local_48 [48];
  BasicSuffix<int> local_18;
  Impl *local_10;
  
  table = (SuffixTable *)(in_RDI + 0x10);
  fmt::BasicStringRef<char>::BasicStringRef
            (&(in_stack_fffffffffffffee0.impl_)->name,(char *)in_stack_fffffffffffffed8);
  this_01 = local_48;
  std::__cxx11::string::string(this_01);
  local_18.super_SuffixBase.impl_ =
       (SuffixBase)
       mp::BasicSuffixSet<std::allocator<char>_>::Add<int>
                 (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,(int)((ulong)this_01 >> 0x20),
                  (int)this_01,table);
  local_10 = (Impl *)local_18.super_SuffixBase.impl_;
  std::__cxx11::string::~string(local_48);
  local_68 = local_10;
  mp::Suffix::Suffix<int>
            (in_stack_fffffffffffffed8,(BasicSuffix<int>)in_stack_fffffffffffffee0.impl_);
  mp::Cast<mp::BasicSuffix<int>>((Suffix)in_stack_fffffffffffffee8.impl_);
  pAVar3 = &local_78;
  testing::internal::EqHelper<false>::Compare<mp::BasicSuffix<int>,mp::BasicSuffix<int>>
            ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,(BasicSuffix<int> *)in_stack_fffffffffffffee8.impl_,
             (BasicSuffix<int> *)in_stack_fffffffffffffee0.impl_);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  type = (Type)((ulong)pAVar3 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff00 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1174e2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff10),type,
               in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffee0.impl_);
    testing::Message::~Message((Message *)0x11753f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x117597);
  s_00.impl_ = (Impl *)local_b0;
  mp::Suffix::Suffix((Suffix *)0x1175a6);
  mp::Cast<mp::BasicSuffix<double>>((Suffix)s_00.impl_);
  pAVar3 = (AssertionResult *)&stack0xffffffffffffff58;
  testing::internal::EqHelper<false>::Compare<mp::Suffix,mp::BasicSuffix<double>>
            ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),(char *)pAVar3,
             (Suffix *)s_00.impl_,(BasicSuffix<double> *)in_stack_fffffffffffffee0.impl_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffefc);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff10));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11764f)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff10),type,
               in_stack_ffffffffffffff00,line,&pAVar3->success_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x11769d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1176ec);
  return;
}

Assistant:

TEST_F(SuffixTest, Cast) {
  mp::IntSuffix is = suffixes_.Add<int>("a", 0, 1);
  Suffix s = is;
  EXPECT_EQ(is, mp::Cast<mp::IntSuffix>(s));
  EXPECT_EQ(Suffix(), mp::Cast<mp::DoubleSuffix>(s));
}